

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

word Exp_Truth6Lit(int nVars,int Lit,word *puFanins,word *puNodes)

{
  if (Lit == -1) {
    return 0;
  }
  if (Lit == -2) {
    return 0xffffffffffffffff;
  }
  if (nVars * 2 <= Lit) {
    return -(ulong)(Lit & 1) ^ puNodes[(int)(((uint)Lit >> 1) - nVars)];
  }
  if ((Lit & 1U) != 0) {
    return ~puFanins[Lit / 2];
  }
  return puFanins[Lit >> 1];
}

Assistant:

static inline word Exp_Truth6Lit( int nVars, int Lit, word * puFanins, word * puNodes )
{
    if ( Lit == EXP_CONST0 )
        return 0;
    if ( Lit == EXP_CONST1 )
        return ~(word)0;
    if ( Lit < 2 * nVars )
        return  (Lit&1) ? ~puFanins[Lit/2] : puFanins[Lit/2];
    return (Lit&1) ? ~puNodes[Lit/2-nVars] : puNodes[Lit/2-nVars];
}